

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btLemkeAlgorithm.cpp
# Opt level: O0

btVectorXf * __thiscall btLemkeAlgorithm::solve(btLemkeAlgorithm *this,uint maxloops)

{
  float fVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  int *piVar6;
  uint in_EDX;
  long in_RSI;
  btVectorXf *in_RDI;
  int i_2;
  int pivotColIndexOld;
  int pivotColIndex;
  int z0Row;
  btScalar v;
  int i_1;
  bool greaterZero;
  btScalar minValue;
  int pivotRowIndex;
  int i;
  btAlignedObjectArray<int> basis;
  btMatrixXf A;
  btMatrixXf mNeg;
  btMatrixXf ident;
  int dim;
  btVectorXf *solutionVector;
  float *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  float in_stack_fffffffffffffe04;
  btAlignedObjectArray<int> *in_stack_fffffffffffffe08;
  btMatrixX<float> *in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  int in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  btAlignedObjectArray<int> *in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  int pivotRowIndex_00;
  btMatrixXf *in_stack_fffffffffffffe38;
  btLemkeAlgorithm *in_stack_fffffffffffffe40;
  btMatrixX<float> *in_stack_fffffffffffffe48;
  int local_184;
  int local_178;
  int local_16c;
  float local_164;
  int local_160;
  int local_15c;
  btAlignedObjectArray<int> local_158 [6];
  int *in_stack_ffffffffffffff70;
  btMatrixXf *in_stack_ffffffffffffff78;
  btLemkeAlgorithm *in_stack_ffffffffffffff80;
  uint local_14;
  
  *(undefined4 *)(in_RSI + 0x80) = 0;
  iVar3 = btVectorX<float>::size((btVectorX<float> *)0x26526b);
  btVectorX<float>::btVectorX
            ((btVectorX<float> *)in_stack_fffffffffffffe10,
             (int)((ulong)in_stack_fffffffffffffe08 >> 0x20));
  btVectorX<float>::setZero
            ((btVectorX<float> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  btMatrixX<float>::btMatrixX
            ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18);
  btMatrixX<float>::setIdentity(in_stack_fffffffffffffe10);
  btMatrixX<float>::negative(in_stack_fffffffffffffe48);
  btMatrixX<float>::btMatrixX
            ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18);
  btMatrixX<float>::setSubMatrix
            ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),(int)in_stack_fffffffffffffe28,
             in_stack_fffffffffffffe24,in_stack_fffffffffffffe20,
             (btMatrixX<float> *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  btMatrixX<float>::setSubMatrix
            ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),(int)in_stack_fffffffffffffe28,
             in_stack_fffffffffffffe24,in_stack_fffffffffffffe20,
             (btMatrixX<float> *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  btMatrixX<float>::setSubMatrix
            ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18,
             (int)((ulong)in_stack_fffffffffffffe10 >> 0x20),(int)in_stack_fffffffffffffe10,
             (float)((ulong)in_stack_fffffffffffffe08 >> 0x20));
  btMatrixX<float>::setSubMatrix
            ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),(int)in_stack_fffffffffffffe28,
             in_stack_fffffffffffffe24,in_stack_fffffffffffffe20,
             (btVectorX<float> *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  btAlignedObjectArray<int>::btAlignedObjectArray
            ((btAlignedObjectArray<int> *)
             CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  for (local_15c = 0; local_15c < iVar3; local_15c = local_15c + 1) {
    btAlignedObjectArray<int>::push_back
              ((btAlignedObjectArray<int> *)in_stack_fffffffffffffe10,
               (int *)in_stack_fffffffffffffe08);
  }
  local_160 = -1;
  local_164 = 1e+30;
  bVar2 = true;
  for (local_16c = 0; iVar4 = local_160, local_16c < iVar3; local_16c = local_16c + 1) {
    pfVar5 = btMatrixX<float>::operator()
                       ((btMatrixX<float> *)
                        CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                        (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                        (int)in_stack_fffffffffffffdf8);
    fVar1 = *pfVar5;
    if (fVar1 < local_164) {
      local_160 = local_16c;
      local_164 = fVar1;
    }
    if (fVar1 < 0.0) {
      bVar2 = false;
    }
  }
  local_178 = iVar3 << 1;
  if (!bVar2) {
    local_14 = in_EDX;
    if (in_EDX == 0) {
      local_14 = 100;
    }
    *(undefined4 *)(in_RSI + 0x80) = 0;
    while (pivotRowIndex_00 = local_178, *(uint *)(in_RSI + 0x80) < local_14) {
      GaussJordanEliminationStep
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                 in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      piVar6 = btAlignedObjectArray<int>::operator[](local_158,local_160);
      if (*piVar6 < iVar3) {
        piVar6 = btAlignedObjectArray<int>::operator[](local_158,local_160);
        local_178 = *piVar6 + iVar3;
      }
      else {
        in_stack_fffffffffffffe40 =
             (btLemkeAlgorithm *)btAlignedObjectArray<int>::operator[](local_158,local_160);
        local_178 = *(int *)in_stack_fffffffffffffe40 - iVar3;
      }
      in_stack_fffffffffffffe38 =
           (btMatrixXf *)btAlignedObjectArray<int>::operator[](local_158,local_160);
      in_stack_fffffffffffffe38->m_rows = pivotRowIndex_00;
      in_stack_fffffffffffffe30 =
           findLexicographicMinimum
                     (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70)
      ;
      if (iVar4 == in_stack_fffffffffffffe30) {
        GaussJordanEliminationStep
                  (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,pivotRowIndex_00,
                   in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
        piVar6 = btAlignedObjectArray<int>::operator[](local_158,in_stack_fffffffffffffe30);
        *piVar6 = local_178;
        break;
      }
      *(int *)(in_RSI + 0x80) = *(int *)(in_RSI + 0x80) + 1;
      in_stack_fffffffffffffe34 = pivotRowIndex_00;
      local_160 = in_stack_fffffffffffffe30;
    }
    bVar2 = validBasis((btLemkeAlgorithm *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    if (!bVar2) {
      *(undefined4 *)(in_RSI + 0x88) = 0xffffffff;
      goto LAB_002658a9;
    }
  }
  local_184 = 0;
  while (iVar3 = local_184, iVar4 = btAlignedObjectArray<int>::size(local_158), iVar3 < iVar4) {
    pfVar5 = btMatrixX<float>::operator()
                       ((btMatrixX<float> *)
                        CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                        (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                        (int)in_stack_fffffffffffffdf8);
    iVar3 = (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
    in_stack_fffffffffffffe04 = *pfVar5;
    btAlignedObjectArray<int>::operator[](local_158,local_184);
    in_stack_fffffffffffffdf8 =
         btVectorX<float>::operator[]
                   ((btVectorX<float> *)
                    CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),iVar3);
    *in_stack_fffffffffffffdf8 = in_stack_fffffffffffffe04;
    local_184 = local_184 + 1;
  }
  *(undefined4 *)(in_RSI + 0x88) = 0;
LAB_002658a9:
  btAlignedObjectArray<int>::~btAlignedObjectArray((btAlignedObjectArray<int> *)0x2658b6);
  btMatrixX<float>::~btMatrixX
            ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  btMatrixX<float>::~btMatrixX
            ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  btMatrixX<float>::~btMatrixX
            ((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  return in_RDI;
}

Assistant:

btVectorXu btLemkeAlgorithm::solve(unsigned int maxloops /* = 0*/)
{
  
    
    steps = 0;

    int dim = m_q.size();
#ifdef BT_DEBUG_OSTREAM
    if(DEBUGLEVEL >= 1) {
      cout << "Dimension = " << dim << endl;
    }
#endif //BT_DEBUG_OSTREAM

	btVectorXu solutionVector(2 * dim);
	solutionVector.setZero();
	  
	  //, INIT, 0.);

	btMatrixXu ident(dim, dim);
	ident.setIdentity();
#ifdef BT_DEBUG_OSTREAM
	cout << m_M << std::endl;
#endif

	btMatrixXu mNeg = m_M.negative();
	  
    btMatrixXu A(dim, 2 * dim + 2);
	//
	A.setSubMatrix(0, 0, dim - 1, dim - 1,ident);
	A.setSubMatrix(0, dim, dim - 1, 2 * dim - 1,mNeg);
	A.setSubMatrix(0, 2 * dim, dim - 1, 2 * dim, -1.f);
	A.setSubMatrix(0, 2 * dim + 1, dim - 1, 2 * dim + 1,m_q);

#ifdef BT_DEBUG_OSTREAM
	cout << A << std::endl;
#endif //BT_DEBUG_OSTREAM


 //   btVectorXu q_;
 //   q_ >> A(0, 2 * dim + 1, dim - 1, 2 * dim + 1);

    btAlignedObjectArray<int> basis;
    //At first, all w-values are in the basis
    for (int i = 0; i < dim; i++)
      basis.push_back(i);

	int pivotRowIndex = -1;
	btScalar minValue = 1e30f;
	bool greaterZero = true;
	for (int i=0;i<dim;i++)
	{
		btScalar v =A(i,2*dim+1);
		if (v<minValue)
		{
			minValue=v;
			pivotRowIndex = i;
		}
		if (v<0)
			greaterZero = false;
	}
	

	
  //  int pivotRowIndex = q_.minIndex();//minIndex(q_);     // first row is that with lowest q-value
    int z0Row = pivotRowIndex;           // remember the col of z0 for ending algorithm afterwards
    int pivotColIndex = 2 * dim;         // first col is that of z0

#ifdef BT_DEBUG_OSTREAM
    if (DEBUGLEVEL >= 3)
	{
    //  cout << "A: " << A << endl;
      cout << "pivotRowIndex " << pivotRowIndex << endl;
      cout << "pivotColIndex " << pivotColIndex << endl;
      cout << "Basis: ";
      for (int i = 0; i < basis.size(); i++)
        cout << basis[i] << " ";
      cout << endl;
    }
#endif //BT_DEBUG_OSTREAM

	if (!greaterZero)
	{

      if (maxloops == 0) {
		  maxloops = 100;
//        maxloops = UINT_MAX; //TODO: not a really nice way, problem is: maxloops should be 2^dim (=1<<dim), but this could exceed UINT_MAX and thus the result would be 0 and therefore the lemke algorithm wouldn't start but probably would find a solution within less then UINT_MAX steps. Therefore this constant is used as a upper border right now...
      }

      /*start looping*/
      for(steps = 0; steps < maxloops; steps++) {

        GaussJordanEliminationStep(A, pivotRowIndex, pivotColIndex, basis);
#ifdef BT_DEBUG_OSTREAM
        if (DEBUGLEVEL >= 3) {
        //  cout << "A: " << A << endl;
          cout << "pivotRowIndex " << pivotRowIndex << endl;
          cout << "pivotColIndex " << pivotColIndex << endl;
          cout << "Basis: ";
          for (int i = 0; i < basis.size(); i++)
            cout << basis[i] << " ";
          cout << endl;
        }
#endif //BT_DEBUG_OSTREAM

        int pivotColIndexOld = pivotColIndex;

        /*find new column index */
        if (basis[pivotRowIndex] < dim) //if a w-value left the basis get in the correspondent z-value
          pivotColIndex = basis[pivotRowIndex] + dim;
        else
          //else do it the other way round and get in the corresponding w-value
          pivotColIndex = basis[pivotRowIndex] - dim;

        /*the column becomes part of the basis*/
        basis[pivotRowIndex] = pivotColIndexOld;

        pivotRowIndex = findLexicographicMinimum(A, pivotColIndex);

        if(z0Row == pivotRowIndex) { //if z0 leaves the basis the solution is found --> one last elimination step is necessary
          GaussJordanEliminationStep(A, pivotRowIndex, pivotColIndex, basis);
          basis[pivotRowIndex] = pivotColIndex; //update basis
          break;
      }

      }
#ifdef BT_DEBUG_OSTREAM
      if(DEBUGLEVEL >= 1) {
        cout << "Number of loops: " << steps << endl;
        cout << "Number of maximal loops: " << maxloops << endl;
      }
#endif //BT_DEBUG_OSTREAM

      if(!validBasis(basis)) {
        info = -1;
#ifdef BT_DEBUG_OSTREAM
        if(DEBUGLEVEL >= 1)
          cerr << "Lemke-Algorithm ended with Ray-Termination (no valid solution)." << endl;
#endif //BT_DEBUG_OSTREAM

        return solutionVector;
      }

    }
#ifdef BT_DEBUG_OSTREAM
    if (DEBUGLEVEL >= 2) {
     // cout << "A: " << A << endl;
      cout << "pivotRowIndex " << pivotRowIndex << endl;
      cout << "pivotColIndex " << pivotColIndex << endl;
    }
#endif //BT_DEBUG_OSTREAM

    for (int i = 0; i < basis.size(); i++)
	{
      solutionVector[basis[i]] = A(i,2*dim+1);//q_[i];
	}

    info = 0;

    return solutionVector;
  }